

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

shared_ptr<mocker::ast::ClassDecl> __thiscall
mocker::Parser::classDecl(Parser *this,TokIter *iter,TokIter end)

{
  Token *pTVar1;
  size_t __n;
  size_t sVar2;
  shared_ptr<mocker::ast::Type> *args;
  Position end_00;
  Position end_01;
  Position end_02;
  Position end_03;
  Position end_04;
  Position end_05;
  bool bVar3;
  pointer psVar4;
  pointer psVar5;
  TokenID TVar6;
  TokenID TVar7;
  int iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  mapped_type *pmVar10;
  CompileError *pCVar11;
  Token *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  element_type *peVar13;
  shared_ptr<mocker::ast::ClassDecl> sVar14;
  Position beg;
  Position beg_00;
  Position beg_01;
  Position beg_02;
  Position beg_03;
  Position beg_04;
  Position beg_05;
  Position beg_06;
  Position end_06;
  Position end_07;
  vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
  local_118;
  shared_ptr<mocker::ast::Identifier> *local_100;
  element_type *local_f0;
  shared_ptr<mocker::ast::CompoundStmt> body;
  shared_ptr<mocker::ast::Identifier> ident;
  shared_ptr<mocker::ast::Identifier> local_c8;
  vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
  members;
  Parser local_88;
  shared_ptr<mocker::ast::FuncDecl> ctor;
  shared_ptr<mocker::ast::Declaration> member;
  pair<mocker::Position,_mocker::Position> ctorPos;
  
  local_f0 = (element_type *)this;
  Token::position(*end._M_current);
  psVar5 = local_118.
           super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar4 = local_118.
           super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var12._M_pi = extraout_RDX;
  if (*end._M_current != in_RCX) {
    TVar6 = Token::tokenID(*end._M_current);
    _Var12._M_pi = extraout_RDX_00;
    if (TVar6 == Class) {
      *(long *)end._M_current = *(long *)end._M_current + 0x38;
      identifier((Parser *)&ident,iter,end);
      if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        pCVar11 = (CompileError *)__cxa_allocate_exception(0x48);
        Token::position(*end._M_current);
        end_00.col = (size_t)local_100;
        end_00.line = (size_t)local_118.
                              super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
        beg_02.col = (size_t)psVar5;
        beg_02.line = (size_t)psVar4;
        CompileError::CompileError(pCVar11,beg_02,end_00);
        *(undefined ***)pCVar11 = &PTR__CompileError_001f2a98;
        __cxa_throw(pCVar11,&SyntaxError::typeinfo,CompileError::~CompileError);
      }
      pTVar1 = *end._M_current;
      *(Token **)end._M_current = pTVar1 + 1;
      if (pTVar1 == in_RCX) {
        TVar6 = Error;
      }
      else {
        TVar6 = Token::tokenID(pTVar1);
      }
      if (TVar6 != LeftBrace) {
        pCVar11 = (CompileError *)__cxa_allocate_exception(0x48);
        Token::position(*end._M_current);
        end_01.col = (size_t)local_100;
        end_01.line = (size_t)local_118.
                              super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
        beg_03.col = (size_t)psVar5;
        beg_03.line = (size_t)psVar4;
        CompileError::CompileError(pCVar11,beg_03,end_01);
        *(undefined ***)pCVar11 = &PTR__CompileError_001f2a98;
        __cxa_throw(pCVar11,&SyntaxError::typeinfo,CompileError::~CompileError);
      }
      members.
      super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      members.
      super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      members.
      super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      do {
        declaration((Parser *)&member,iter,end);
        if (member.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            == (element_type *)0x0) {
          if (*end._M_current == in_RCX) {
            TVar6 = Error;
          }
          else {
            TVar6 = Token::tokenID(*end._M_current);
          }
          bVar3 = false;
          TVar7 = Error;
          if (TVar6 == Identifier) {
            if ((Token *)(*(long *)end._M_current + 0x38) != in_RCX) {
              TVar7 = Token::tokenID((Token *)(*(long *)end._M_current + 0x38));
            }
            if (TVar7 == LeftParen) {
              pbVar9 = Token::val<std::__cxx11::string>(*end._M_current);
              __n = pbVar9->_M_string_length;
              if (__n == ((ident.
                           super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->val)._M_string_length) {
                if (__n != 0) {
                  iVar8 = bcmp((pbVar9->_M_dataplus)._M_p,
                               ((ident.
                                 super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->val)._M_dataplus._M_p,__n);
                  if (iVar8 != 0) goto LAB_00184465;
                }
                if (in_RCX <= *end._M_current + 3) {
                  pCVar11 = (CompileError *)__cxa_allocate_exception(0x48);
                  Token::position(*end._M_current);
                  end_03.col = (size_t)local_100;
                  end_03.line = (size_t)local_118.
                                        super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  beg_05.col = (size_t)psVar5;
                  beg_05.line = (size_t)psVar4;
                  CompileError::CompileError(pCVar11,beg_05,end_03);
                  *(undefined ***)pCVar11 = &PTR__CompileError_001f2a98;
                  __cxa_throw(pCVar11,&SyntaxError::typeinfo,CompileError::~CompileError);
                }
                Token::position(*end._M_current);
                *(long *)end._M_current = *(long *)end._M_current + 0xa8;
                compoundStmt((Parser *)&body,iter,end);
                if (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr == (element_type *)0x0) {
                  pCVar11 = (CompileError *)__cxa_allocate_exception(0x48);
                  Token::position(*end._M_current);
                  end_04.col = (size_t)local_100;
                  end_04.line = (size_t)local_118.
                                        super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  beg_06.col = (size_t)psVar5;
                  beg_06.line = (size_t)psVar4;
                  CompileError::CompileError(pCVar11,beg_06,end_04);
                  *(undefined ***)pCVar11 = &PTR__CompileError_001f2a98;
                  __cxa_throw(pCVar11,&SyntaxError::typeinfo,CompileError::~CompileError);
                }
                local_88.pos = (unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                                *)body.
                                  super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr;
                pmVar10 = std::__detail::
                          _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)iter[2]._M_current,(key_type *)&local_88.pos);
                sVar2 = (pmVar10->second).line;
                args = (shared_ptr<mocker::ast::Type> *)(pmVar10->second).col;
                local_c8.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
                local_c8.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                end_05.col = ctorPos.second.line;
                end_05.line = ctorPos.first.col;
                beg.col = ctorPos.first.line;
                beg.line = (size_t)iter;
                makeNode<mocker::ast::Identifier,char_const(&)[7]>
                          (&local_88,beg,end_05,(char (*) [7])ctorPos.second.col);
                local_118.
                super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_118.
                super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_118.
                super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                beg_00.col = ctorPos.first.line;
                beg_00.line = (size_t)iter;
                end_06.col = sVar2;
                end_06.line = ctorPos.first.col;
                makeNode<mocker::ast::FuncDecl,std::shared_ptr<mocker::ast::Type>,std::shared_ptr<mocker::ast::Identifier>,std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>>>,std::shared_ptr<mocker::ast::CompoundStmt>&>
                          ((Parser *)&ctor,beg_00,end_06,args,&local_c8,
                           (vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                            *)&local_88,(shared_ptr<mocker::ast::CompoundStmt> *)&local_118);
                std::
                vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                ::~vector(&local_118);
                if (local_88.tokEnd._M_current != (Token *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_88.tokEnd._M_current);
                }
                if (local_c8.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_c8.
                             super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                std::
                vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>
                ::emplace_back<std::shared_ptr<mocker::ast::FuncDecl>&>
                          ((vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>
                            *)&members,&ctor);
                if (ctor.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (ctor.
                             super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (body.
                             super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                bVar3 = true;
                goto LAB_00184468;
              }
            }
LAB_00184465:
            bVar3 = false;
          }
        }
        else {
          bVar3 = true;
          std::
          vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>
          ::emplace_back<std::shared_ptr<mocker::ast::Declaration>&>
                    ((vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>
                      *)&members,&member);
        }
LAB_00184468:
        if (member.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (member.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      } while (bVar3);
      if (*end._M_current == in_RCX) {
        TVar6 = Error;
      }
      else {
        TVar6 = Token::tokenID(*end._M_current);
      }
      if (TVar6 != RightBrace) {
        pCVar11 = (CompileError *)__cxa_allocate_exception(0x48);
        Token::position(*end._M_current);
        end_02.col = (size_t)local_100;
        end_02.line = (size_t)local_118.
                              super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
        beg_04.col = (size_t)psVar5;
        beg_04.line = (size_t)psVar4;
        CompileError::CompileError(pCVar11,beg_04,end_02);
        *(undefined ***)pCVar11 = &PTR__CompileError_001f2a98;
        __cxa_throw(pCVar11,&SyntaxError::typeinfo,CompileError::~CompileError);
      }
      pTVar1 = *end._M_current;
      *(Token **)end._M_current = pTVar1 + 1;
      Token::position(pTVar1);
      peVar13 = local_f0;
      beg_01.col = (size_t)psVar4;
      beg_01.line = (size_t)iter;
      end_07.col = (size_t)local_118.
                           super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      end_07.line = (size_t)psVar5;
      makeNode<mocker::ast::ClassDecl,std::shared_ptr<mocker::ast::Identifier>&,std::vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>>
                ((Parser *)local_f0,beg_01,end_07,local_100,
                 (vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
                  *)&ident);
      std::
      vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
      ::~vector(&members);
      _Var12._M_pi = extraout_RDX_01;
      if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var12._M_pi = extraout_RDX_02;
      }
      goto LAB_001846a2;
    }
  }
  (local_f0->super_Declaration).super_ASTNode._vptr_ASTNode = (_func_int **)0x0;
  (local_f0->super_Declaration).super_ASTNode.super_enable_shared_from_this<mocker::ast::ASTNode>.
  _M_weak_this.super___weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  peVar13 = local_f0;
LAB_001846a2:
  sVar14.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  sVar14.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar13;
  return (shared_ptr<mocker::ast::ClassDecl>)
         sVar14.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::ClassDecl> Parser::classDecl(TokIter &iter, TokIter end) {
  auto id = GetTokenID(end);
  auto begPos = iter->position().first;
  auto throwError = [begPos, &iter] {
    throw SyntaxError(begPos, iter->position().second);
  };

  if (id(iter) != TokenID::Class)
    return nullptr;
  ++iter;
  auto ident = identifier(iter, end);
  if (!ident)
    throwError();
  if (id(iter++) != TokenID::LeftBrace)
    throwError();
  std::vector<std::shared_ptr<ast::Declaration>> members;
  while (true) {
    auto member = declaration(iter, end);
    if (member) {
      members.emplace_back(member);
      continue;
    }
    // ctor
    if (id(iter) == TokenID::Identifier && id(iter + 1) == TokenID::LeftParen &&
        iter->val<std::string>() == ident->val) {
      if (iter + 3 >= end)
        throwError();
      auto ctorPos = iter->position();
      iter += 3;
      auto body = compoundStmt(iter, end);
      if (!body)
        throwError();
      auto ctor = makeNode<ast::FuncDecl>(
          ctorPos.first, pos[body->getID()].second,
          std::shared_ptr<ast::Type>(nullptr),
          makeNode<ast::Identifier>(ctorPos.first, ctorPos.second, "_ctor_"),
          std::vector<std::shared_ptr<ast::VarDeclStmt>>(), body);
      members.emplace_back(ctor);
      continue;
    }
    break;
  }
  if (id(iter) != TokenID::RightBrace)
    throwError();
  return makeNode<ast::ClassDecl>(begPos, (iter++)->position().second, ident,
                                  std::move(members));
}